

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluHashTableCheck(If_Man_t *p)

{
  word *t;
  byte bVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  
  iVar2 = p->nTableSize[1];
  if (0 < iVar2) {
    lVar5 = 0;
    do {
      plVar4 = (long *)p->pHashTable[1][lVar5];
      if (plVar4 != (long *)0x0) {
        do {
          bVar1 = *(byte *)(plVar4 + 1);
          t = (word *)(plVar4 + 2);
          iVar2 = If_CluSupportSize(t,0xd);
          uVar3 = If_CutPerformCheck16((If_Man_t *)0x0,(uint *)t,0xd,iVar2,"555");
          if (uVar3 != ((bVar1 & 0xf) != 0)) {
            Kit_DsdPrintFromTruth((uint *)t,0xd);
            putchar(10);
            iVar2 = If_CluSupportSize(t,0xd);
            If_CutPerformCheck16((If_Man_t *)0x0,(uint *)t,0xd,iVar2,"555");
            puts("Hash table problem!!!");
          }
          plVar4 = (long *)*plVar4;
        } while (plVar4 != (long *)0x0);
        iVar2 = p->nTableSize[1];
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  return;
}

Assistant:

void If_CluHashTableCheck( If_Man_t * p )
{
    int t = 1;
    If_Hte_t * pEntry;
    int i, RetValue, Status;
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
        {        
            Status = ((pEntry->Group & 15) > 0);
            RetValue = If_CutPerformCheck16( NULL, (unsigned *)pEntry->pTruth, 13, If_CluSupportSize(pEntry->pTruth, 13), "555" );
            if ( RetValue != Status ) 
            {
                Kit_DsdPrintFromTruth( (unsigned*)pEntry->pTruth, 13 ); printf( "\n" );
                RetValue = If_CutPerformCheck16( NULL, (unsigned *)pEntry->pTruth, 13, If_CluSupportSize(pEntry->pTruth, 13), "555" );
                printf( "Hash table problem!!!\n" );
            }
        }
    }
}